

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O1

void CameraMoveRight(Camera *camera,float distance,_Bool moveInWorldPlane)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined3 in_register_00000031;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vector3 VVar9;
  
  VVar9 = GetCameraRight(camera);
  fVar7 = VVar9.z;
  fVar8 = VVar9.x;
  fVar6 = VVar9.y;
  if (CONCAT31(in_register_00000031,moveInWorldPlane) != 0) {
    fVar5 = fVar7 * fVar7 + fVar8 * fVar8 + 0.0;
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    if ((fVar5 != 0.0) || (NAN(fVar5))) {
      fVar5 = 1.0 / fVar5;
      fVar8 = fVar8 * fVar5;
      fVar6 = fVar5 * 0.0;
      fVar7 = fVar7 * fVar5;
    }
    else {
      fVar6 = 0.0;
    }
  }
  uVar1 = (camera->position).x;
  uVar3 = (camera->position).y;
  uVar2 = (camera->target).x;
  uVar4 = (camera->target).y;
  (camera->position).x = fVar8 * distance + (float)uVar1;
  (camera->position).y = (float)uVar3 + fVar6 * distance;
  (camera->position).z = (camera->position).z + fVar7 * distance;
  (camera->target).x = fVar8 * distance + (float)uVar2;
  (camera->target).y = (float)uVar4 + fVar6 * distance;
  (camera->target).z = fVar7 * distance + (camera->target).z;
  return;
}

Assistant:

void CameraMoveRight(Camera *camera, float distance, bool moveInWorldPlane)
{
    Vector3 right = GetCameraRight(camera);

    if (moveInWorldPlane)
    {
        // Project vector onto world plane
        right.y = 0;
        right = Vector3Normalize(right);
    }

    // Scale by distance
    right = Vector3Scale(right, distance);

    // Move position and target
    camera->position = Vector3Add(camera->position, right);
    camera->target = Vector3Add(camera->target, right);
}